

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void nlohmann::adl_serializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::
     from_json(json *aJson,ByteArray *aBuf)

{
  JsonException *this;
  Error local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Error local_48;
  
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_68,aJson);
  ot::commissioner::utils::Hex(&local_90,aBuf,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMessage._M_dataplus._M_p != &local_90.mMessage.field_2) {
    operator_delete(local_90.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_90.mCode == kNone) {
    return;
  }
  this = (JsonException *)__cxa_allocate_exception(0x38);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,aJson);
  ot::commissioner::utils::Hex(&local_48,aBuf,(string *)&local_90);
  ot::commissioner::JsonException::JsonException(this,&local_48);
  __cxa_throw(this,&ot::commissioner::JsonException::typeinfo,
              ot::commissioner::JsonException::~JsonException);
}

Assistant:

static void from_json(const json &aJson, ot::commissioner::ByteArray &aBuf)
    {
        SuccessOrThrow(::ot::commissioner::utils::Hex(aBuf, aJson.get<std::string>()));
    }